

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

int string_query(lua_State *L)

{
  byte bVar1;
  int iVar2;
  global_State *pgVar3;
  StkId pTVar4;
  lua_Integer lVar5;
  GCObject *pGVar6;
  char *__assertion;
  int iVar7;
  
  pgVar3 = L->l_G;
  lVar5 = luaL_optinteger(L,1,0);
  iVar2 = (pgVar3->strt).size;
  if ((int)lVar5 == 0) {
    lua_pushinteger(L,(long)iVar2);
    lua_pushinteger(L,(long)(pgVar3->strt).nuse);
    iVar7 = 2;
  }
  else {
    iVar7 = 0;
    if (((int)lVar5 <= iVar2) &&
       (pGVar6 = *(GCObject **)
                  ((long)(pgVar3->strt).hash + ((lVar5 << 0x20) + -0x100000000 >> 0x1d)), iVar7 = 0,
       pGVar6 != (GCObject *)0x0)) {
      iVar7 = 0;
      do {
        if (9 < (pGVar6->tt & 0xe)) {
          __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
LAB_0014c172:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x36b,"int string_query(lua_State *)");
        }
        pTVar4 = L->top;
        (pTVar4->value_).gc = pGVar6;
        bVar1 = pGVar6->tt;
        pTVar4->tt_ = bVar1 | 0x8000;
        if (((char)bVar1 < '\0') ||
           ((L != (lua_State *)0x0 && ((pGVar6->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))) {
          __assertion = "0";
          goto LAB_0014c172;
        }
        pTVar4 = L->top;
        L->top = pTVar4 + 1;
        if (L->ci->top < pTVar4 + 1) {
          __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x36c,"int string_query(lua_State *)");
        }
        iVar7 = iVar7 + 1;
        pGVar6 = pGVar6[1].next;
      } while (pGVar6 != (GCObject *)0x0);
    }
  }
  return iVar7;
}

Assistant:

static int string_query (lua_State *L) {
  stringtable *tb = &G(L)->strt;
  int s = cast_int(luaL_optinteger(L, 1, 0)) - 1;
  if (s == -1) {
    lua_pushinteger(L ,tb->size);
    lua_pushinteger(L ,tb->nuse);
    return 2;
  }
  else if (s < tb->size) {
    TString *ts;
    int n = 0;
    for (ts = tb->hash[s]; ts != NULL; ts = ts->u.hnext) {
      setsvalue2s(L, L->top, ts);
      api_incr_top(L);
      n++;
    }
    return n;
  }
  else return 0;
}